

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * __thiscall Lowerer::LowerNewScArray(Lowerer *this,Instr *arrInstr)

{
  ProfileId index;
  IntConstOpnd *this_00;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  uint32 length;
  Instr *pIVar4;
  JITTimeFunctionBody *pJVar5;
  intptr_t weakFuncRef;
  undefined4 *puVar6;
  JITTimeProfileInfo *pJVar7;
  ArrayCallSiteInfo *arrayInfo;
  intptr_t arrayInfoAddr;
  AddrOpnd *pAVar8;
  Opnd *pOVar9;
  JnHelperMethod helperMethod;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32;
  
  if (arrInstr->m_kind == InstrKindJitProfiling) {
    pIVar4 = LowerProfiledNewScArray(this,(JitProfilingInstr *)arrInstr);
    return pIVar4;
  }
  pIVar4 = arrInstr->m_prev;
  helperMethod = HelperScrArr_OP_NewScArray;
  if (arrInstr->m_kind == InstrKindProfiled) {
    pJVar5 = JITTimeWorkItem::GetJITFunctionBody(arrInstr->m_func->m_workItem);
    bVar2 = JITTimeFunctionBody::HasProfileInfo(pJVar5);
    if (!bVar2) goto LAB_005b0d71;
    weakFuncRef = Func::GetWeakFuncRef(arrInstr->m_func);
    if (weakFuncRef == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0xe34,"(weakFuncRef)","weakFuncRef");
      if (!bVar2) goto LAB_005b0dc5;
      *puVar6 = 0;
    }
    if (arrInstr->m_kind != InstrKindProfiled) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
      if (!bVar2) goto LAB_005b0dc5;
      *puVar6 = 0;
    }
    index = *(ProfileId *)&arrInstr[1]._vptr_Instr;
    pJVar5 = JITTimeWorkItem::GetJITFunctionBody(arrInstr->m_func->m_workItem);
    pJVar7 = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar5);
    arrayInfo = JITTimeProfileInfo::GetArrayCallSiteInfo(pJVar7,index);
    pJVar5 = JITTimeWorkItem::GetJITFunctionBody(arrInstr->m_func->m_workItem);
    pJVar7 = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar5);
    arrayInfoAddr = JITTimeProfileInfo::GetArrayCallSiteInfoAddr(pJVar7,index);
    pOVar9 = arrInstr->m_src1;
    OVar3 = IR::Opnd::GetKind(pOVar9);
    if (OVar3 != OpndKindIntConst) {
      OVar3 = IR::Opnd::GetKind(pOVar9);
      if (OVar3 != OpndKindInt64Const) {
        OVar3 = IR::Opnd::GetKind(pOVar9);
        if (OVar3 != OpndKindAddr) {
          OVar3 = IR::Opnd::GetKind(pOVar9);
          if (OVar3 != OpndKindHelperCall) {
            OVar3 = IR::Opnd::GetKind(pOVar9);
            if (OVar3 != OpndKindFloatConst) {
              OVar3 = IR::Opnd::GetKind(pOVar9);
              if (OVar3 != OpndKindSimd128Const) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
                *puVar6 = 1;
                bVar2 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                                   ,0xe3a,"(arrInstr->GetSrc1()->IsConstOpnd())",
                                   "arrInstr->GetSrc1()->IsConstOpnd()");
                if (!bVar2) goto LAB_005b0dc5;
                *puVar6 = 0;
              }
            }
          }
        }
      }
    }
    this_00 = (IntConstOpnd *)arrInstr->m_src1;
    OVar3 = IR::Opnd::GetKind((Opnd *)this_00);
    if (OVar3 != OpndKindIntConst) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
      if (!bVar2) {
LAB_005b0dc5:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
    length = IR::IntConstOpnd::AsUint32(this_00);
    GenerateProfiledNewScArrayFastPath(this,arrInstr,arrayInfo,arrayInfoAddr,weakFuncRef,length);
    if (arrInstr->m_dst != (Opnd *)0x0) {
      local_32 = (arrInstr->m_dst->m_valueType).field_0;
      bVar2 = ValueType::IsLikelyNativeArray((ValueType *)&local_32.field_0);
      if (bVar2) {
        pAVar8 = IR::AddrOpnd::New(weakFuncRef,AddrOpndKindDynamicFunctionBodyWeakRef,this->m_func,
                                   false,(Var)0x0);
        LowererMD::LoadHelperArgument(&this->m_lowererMD,arrInstr,&pAVar8->super_Opnd);
        pAVar8 = IR::AddrOpnd::New(arrayInfoAddr,AddrOpndKindDynamicArrayCallSiteInfo,this->m_func,
                                   false,(Var)0x0);
        LowererMD::LoadHelperArgument(&this->m_lowererMD,arrInstr,&pAVar8->super_Opnd);
        helperMethod = HelperScrArr_ProfiledNewScArray;
      }
    }
  }
LAB_005b0d71:
  LoadScriptContext(this,arrInstr);
  pOVar9 = IR::Instr::UnlinkSrc1(arrInstr);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,arrInstr,pOVar9);
  LowererMD::ChangeToHelperCall
            (&this->m_lowererMD,arrInstr,helperMethod,(LabelInstr *)0x0,(Opnd *)0x0,
             (PropertySymOpnd *)0x0,false);
  return pIVar4;
}

Assistant:

IR::Instr *
Lowerer::LowerNewScArray(IR::Instr *arrInstr)
{
    if (arrInstr->IsJitProfilingInstr())
    {
        return LowerProfiledNewScArray(arrInstr->AsJitProfilingInstr());
    }

    IR::Instr *instrPrev = arrInstr->m_prev;
    IR::JnHelperMethod helperMethod = IR::HelperScrArr_OP_NewScArray;

    if (arrInstr->IsProfiledInstr() && arrInstr->m_func->HasProfileInfo())
    {
        intptr_t weakFuncRef = arrInstr->m_func->GetWeakFuncRef();
        Assert(weakFuncRef);

        Js::ProfileId profileId = static_cast<Js::ProfileId>(arrInstr->AsProfiledInstr()->u.profileId);
        Js::ArrayCallSiteInfo *arrayInfo = arrInstr->m_func->GetReadOnlyProfileInfo()->GetArrayCallSiteInfo(profileId);
        intptr_t arrayInfoAddr = arrInstr->m_func->GetReadOnlyProfileInfo()->GetArrayCallSiteInfoAddr(profileId);

        Assert(arrInstr->GetSrc1()->IsConstOpnd());
        GenerateProfiledNewScArrayFastPath(arrInstr, arrayInfo, arrayInfoAddr, weakFuncRef, arrInstr->GetSrc1()->AsIntConstOpnd()->AsUint32());

        if (arrInstr->GetDst() && arrInstr->GetDst()->GetValueType().IsLikelyNativeArray())
        {
            m_lowererMD.LoadHelperArgument(arrInstr, IR::AddrOpnd::New(weakFuncRef, IR::AddrOpndKindDynamicFunctionBodyWeakRef, m_func));
            m_lowererMD.LoadHelperArgument(arrInstr, IR::AddrOpnd::New(arrayInfoAddr, IR::AddrOpndKindDynamicArrayCallSiteInfo, m_func));
            helperMethod = IR::HelperScrArr_ProfiledNewScArray;
        }
    }

    LoadScriptContext(arrInstr);

    IR::Opnd *src1Opnd = arrInstr->UnlinkSrc1();
    m_lowererMD.LoadHelperArgument(arrInstr, src1Opnd);
    m_lowererMD.ChangeToHelperCall(arrInstr, helperMethod);

    return instrPrev;
}